

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prefix.cpp
# Opt level: O2

Prefix * duckdb::Prefix::GetTail(Prefix *__return_storage_ptr__,ART *art,Node *node)

{
  Node ptr_p;
  Prefix local_48;
  
  Prefix(__return_storage_ptr__,art,(Node)(node->super_IndexPointer).data,true,false);
  while (ptr_p.super_IndexPointer.data =
              (IndexPointer)(__return_storage_ptr__->ptr->super_IndexPointer).data,
        ((ulong)ptr_p.super_IndexPointer.data & 0x7f00000000000000) == 0x100000000000000) {
    Prefix(&local_48,art,ptr_p,true,false);
    __return_storage_ptr__->in_memory = local_48.in_memory;
    __return_storage_ptr__->data = local_48.data;
    __return_storage_ptr__->ptr = local_48.ptr;
  }
  return __return_storage_ptr__;
}

Assistant:

Prefix Prefix::GetTail(ART &art, const Node &node) {
	Prefix prefix(art, node, true);
	while (prefix.ptr->GetType() == PREFIX) {
		prefix = Prefix(art, *prefix.ptr, true);
	}
	return prefix;
}